

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TempFile * perfetto::base::TempFile::Create(void)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int r;
  char *pcVar4;
  undefined8 uVar5;
  uint *puVar6;
  int *piVar7;
  char *pcVar8;
  TempFile *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 local_11;
  TempFile *temp_file;
  
  local_11 = 0;
  TempFile(in_RDI);
  GetSysTempDir_abi_cxx11_();
  ::std::operator+(&local_38,&local_58,"/perfetto-XXXXXXXX");
  ::std::__cxx11::string::operator=((string *)&in_RDI->path_,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)&in_RDI->path_);
  r = mkstemp(pcVar4);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&in_RDI->fd_,r);
  bVar3 = ScopedResource::operator_cast_to_bool((ScopedResource *)in_RDI);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    uVar5 = ::std::__cxx11::string::c_str();
    puVar6 = (uint *)__errno_location();
    uVar1 = *puVar6;
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    LogMessage(kLogError,pcVar4,0x18d5,"Could not create temp file %s (errno: %d, %s)",uVar5,
               (ulong)uVar1,pcVar8);
    MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  return in_RDI;
}

Assistant:

TempFile TempFile::Create() {
  TempFile temp_file;
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  temp_file.path_ = GetSysTempDir() + "\\" + GetTempName();
  // Several tests want to read-back the temp file while still open. On Windows,
  // that requires FILE_SHARE_READ. FILE_SHARE_READ is NOT settable when using
  // the POSIX-compat equivalent function _open(). Hence the CreateFileA +
  // _open_osfhandle dance here.
  HANDLE h =
      ::CreateFileA(temp_file.path_.c_str(), GENERIC_READ | GENERIC_WRITE,
                    FILE_SHARE_DELETE | FILE_SHARE_READ, nullptr, CREATE_ALWAYS,
                    FILE_ATTRIBUTE_TEMPORARY, nullptr);
  PERFETTO_CHECK(PlatformHandleChecker::IsValid(h));
  // According to MSDN, when using _open_osfhandle the caller must not call
  // CloseHandle(). Ownership is moved to the file descriptor, which then needs
  // to be closed with just with _close().
  temp_file.fd_.reset(_open_osfhandle(reinterpret_cast<intptr_t>(h), 0));
#else
  temp_file.path_ = GetSysTempDir() + "/perfetto-XXXXXXXX";
  temp_file.fd_.reset(mkstemp(&temp_file.path_[0]));
#endif
  if (PERFETTO_UNLIKELY(!temp_file.fd_)) {
    PERFETTO_FATAL("Could not create temp file %s", temp_file.path_.c_str());
  }
  return temp_file;
}